

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::handleExtremes(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp)

{
  pointer pnVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  Item *pIVar3;
  char cVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  FreeConstraintPS *this_02;
  _func_int **pp_Var9;
  int *piVar10;
  long lVar11;
  char *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  int32_t iVar14;
  int iVar15;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  SPxOut *pSVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  pointer pnVar21;
  char *__filename;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  uint *puVar23;
  uint *puVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar26;
  fpclass_type fVar27;
  int32_t *piVar28;
  ulong uVar29;
  Item *pIVar30;
  long in_FS_OFFSET;
  byte bVar31;
  Real eps;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  undefined1 local_c78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c70;
  undefined1 local_c68 [16];
  undefined1 local_c58 [16];
  undefined1 local_c48 [16];
  undefined1 local_c38 [16];
  undefined1 local_c28 [16];
  uint local_c18 [3];
  undefined3 uStack_c0b;
  int iStack_c08;
  bool bStack_c04;
  undefined8 local_c00;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_bf0;
  ulong local_be8;
  ulong local_be0;
  ulong local_bd8;
  int local_bcc;
  ulong local_bc8;
  undefined4 local_bbc;
  Item *local_bb8;
  ulong uStack_bb0;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_ba8;
  ulong local_ba0;
  Item *local_b98;
  ulong uStack_b90;
  Item *local_b88;
  ulong uStack_b80;
  cpp_dec_float<200U,_int,_void> local_b78;
  cpp_dec_float<200U,_int,_void> local_af8;
  undefined1 local_a78 [32];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [13];
  undefined3 uStack_a0b;
  int iStack_a08;
  bool bStack_a04;
  undefined8 local_a00;
  shared_ptr<soplex::Tolerances> local_9f8;
  cpp_dec_float<200U,_int,_void> local_9e8;
  cpp_dec_float<200U,_int,_void> local_968;
  cpp_dec_float<200U,_int,_void> local_8e8;
  cpp_dec_float<200U,_int,_void> local_860;
  cpp_dec_float<200U,_int,_void> local_7e0;
  cpp_dec_float<200U,_int,_void> local_760;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_660;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_560;
  cpp_dec_float<200U,_int,_void> local_4e0;
  cpp_dec_float<200U,_int,_void> local_460;
  cpp_dec_float<200U,_int,_void> local_3e0;
  cpp_dec_float<200U,_int,_void> local_360;
  cpp_dec_float<200U,_int,_void> local_2e0;
  uint local_260 [28];
  uint local_1f0 [28];
  uint local_180 [28];
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar31 = 0;
  local_bf0 = this;
  ::soplex::infinity::__tls_init();
  local_bb8 = *(Item **)(in_FS_OFFSET + -8);
  local_8e8.fpclass = cpp_dec_float_finite;
  local_8e8.prec_elem = 0x1c;
  local_8e8.data._M_elems[0] = 0;
  local_8e8.data._M_elems[1] = 0;
  local_8e8.data._M_elems[2] = 0;
  local_8e8.data._M_elems[3] = 0;
  local_8e8.data._M_elems[4] = 0;
  local_8e8.data._M_elems[5] = 0;
  local_8e8.data._M_elems[6] = 0;
  local_8e8.data._M_elems[7] = 0;
  local_8e8.data._M_elems[8] = 0;
  local_8e8.data._M_elems[9] = 0;
  local_8e8.data._M_elems[10] = 0;
  local_8e8.data._M_elems[0xb] = 0;
  local_8e8.data._M_elems[0xc] = 0;
  local_8e8.data._M_elems[0xd] = 0;
  local_8e8.data._M_elems[0xe] = 0;
  local_8e8.data._M_elems[0xf] = 0;
  local_8e8.data._M_elems[0x10] = 0;
  local_8e8.data._M_elems[0x11] = 0;
  local_8e8.data._M_elems[0x12] = 0;
  local_8e8.data._M_elems[0x13] = 0;
  local_8e8.data._M_elems[0x14] = 0;
  local_8e8.data._M_elems[0x15] = 0;
  local_8e8.data._M_elems[0x16] = 0;
  local_8e8.data._M_elems[0x17] = 0;
  local_8e8.data._M_elems[0x18] = 0;
  local_8e8.data._M_elems[0x19] = 0;
  local_8e8.data._M_elems._104_5_ = 0;
  local_8e8.data._M_elems[0x1b]._1_3_ = 0;
  local_8e8.exp = 0;
  local_8e8.neg = false;
  uStack_bb0 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_8e8,(double)local_bb8);
  local_9e8.fpclass = cpp_dec_float_finite;
  local_9e8.prec_elem = 0x1c;
  local_9e8.data._M_elems[0] = 0;
  local_9e8.data._M_elems[1] = 0;
  local_9e8.data._M_elems[2] = 0;
  local_9e8.data._M_elems[3] = 0;
  local_9e8.data._M_elems[4] = 0;
  local_9e8.data._M_elems[5] = 0;
  local_9e8.data._M_elems[6] = 0;
  local_9e8.data._M_elems[7] = 0;
  local_9e8.data._M_elems[8] = 0;
  local_9e8.data._M_elems[9] = 0;
  local_9e8.data._M_elems[10] = 0;
  local_9e8.data._M_elems[0xb] = 0;
  local_9e8.data._M_elems[0xc] = 0;
  local_9e8.data._M_elems[0xd] = 0;
  local_9e8.data._M_elems[0xe] = 0;
  local_9e8.data._M_elems[0xf] = 0;
  local_9e8.data._M_elems[0x10] = 0;
  local_9e8.data._M_elems[0x11] = 0;
  local_9e8.data._M_elems[0x12] = 0;
  local_9e8.data._M_elems[0x13] = 0;
  local_9e8.data._M_elems[0x14] = 0;
  local_9e8.data._M_elems[0x15] = 0;
  local_9e8.data._M_elems[0x16] = 0;
  local_9e8.data._M_elems[0x17] = 0;
  local_9e8.data._M_elems[0x18] = 0;
  local_9e8.data._M_elems[0x19] = 0;
  local_9e8.data._M_elems._104_5_ = 0;
  local_9e8.data._M_elems[0x1b]._1_3_ = 0;
  local_9e8.exp = 0;
  local_9e8.neg = false;
  local_c00._0_4_ = cpp_dec_float_finite;
  local_c00._4_4_ = 0x1c;
  _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                )ZEXT816(0);
  local_c68 = ZEXT816(0);
  local_c58 = ZEXT816(0);
  local_c48 = ZEXT816(0);
  local_c38 = ZEXT816(0);
  local_c28 = ZEXT816(0);
  local_c18[0] = 0;
  local_c18[1] = 0;
  stack0xfffffffffffff3f0 = 0;
  uStack_c0b = 0;
  iStack_c08 = 0;
  bStack_c04 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_c78,5.0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_9e8,&local_8e8,(cpp_dec_float<200U,_int,_void> *)local_c78);
  pSVar16 = local_bf0;
  feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_af8,local_bf0);
  local_c00._0_4_ = cpp_dec_float_finite;
  local_c00._4_4_ = 0x1c;
  _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                )ZEXT816(0);
  local_c68 = ZEXT816(0);
  local_c58 = ZEXT816(0);
  local_c48 = ZEXT816(0);
  local_c38 = ZEXT816(0);
  local_c28 = ZEXT816(0);
  local_c18[0] = 0;
  local_c18[1] = 0;
  stack0xfffffffffffff3f0 = 0;
  uStack_c0b = 0;
  iStack_c08 = 0;
  bStack_c04 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_c78,0.01);
  pcVar22 = &local_af8;
  pcVar25 = &local_8e8;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pcVar25->data)._M_elems[0] =
         (((cpp_dec_float<200U,_int,_void> *)&pcVar22->data)->data)._M_elems[0];
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar31 * -2 + 1) * 4);
    pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar31 * -8 + 4);
  }
  local_8e8.exp = local_af8.exp;
  local_8e8.neg = local_af8.neg;
  local_8e8.fpclass = local_af8.fpclass;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_8e8,(cpp_dec_float<200U,_int,_void> *)local_c78);
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_af8,pSVar16);
  fVar27 = local_8e8.fpclass;
  if (((local_8e8.fpclass == cpp_dec_float_NaN) || (local_af8.fpclass == cpp_dec_float_NaN)) ||
     (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&local_8e8,&local_af8), fVar27 = local_8e8.fpclass, -1 < iVar7)) {
    piVar28 = &local_8e8.prec_elem;
    pcVar22 = &local_8e8;
    puVar23 = (uint *)local_c78;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar23 = (pcVar22->data)._M_elems[0];
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
      puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
    }
    iStack_c08 = local_8e8.exp;
    bStack_c04 = local_8e8.neg;
    local_c00._0_4_ = fVar27;
  }
  else {
    epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_c78,pSVar16);
    piVar28 = (int32_t *)((long)&local_c00 + 4);
    fVar27 = (fpclass_type)local_c00;
  }
  iVar14 = *piVar28;
  puVar23 = (uint *)local_c78;
  pcVar22 = &local_8e8;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pcVar22->data)._M_elems[0] = *puVar23;
    puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
    pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
  }
  local_8e8.exp = iStack_c08;
  local_8e8.neg = bStack_c04;
  local_8e8.prec_elem = iVar14;
  local_8e8.fpclass = fVar27;
  uVar19 = (ulong)(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
  local_bcc = 0;
  local_bd8 = 0;
  local_ba0 = 0;
  if (0 < (long)uVar19) {
    local_b98 = (Item *)((ulong)local_bb8 ^ 0x8000000000000000);
    uStack_b90 = uStack_bb0 ^ 0x8000000000000000;
    local_ba8 = &pSVar16->m_hist;
    uVar29 = uVar19 << 7;
    local_ba0 = 0;
    local_bd8 = 0;
    do {
      local_bc8 = uVar19;
      pnVar1 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar23 = (uint *)((long)pnVar1[-1].m_backend.data._M_elems + uVar29);
      pcVar22 = &local_af8;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar22->data)._M_elems[0] = *puVar23;
        puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
      }
      local_af8.exp = *(int *)((long)(&pnVar1[-1].m_backend.data + 1) + uVar29);
      local_af8.neg = (bool)*(byte *)((long)(&pnVar1[-1].m_backend.data + 1) + uVar29 + 4);
      local_af8.fpclass = *(fpclass_type *)((long)(&pnVar1[-1].m_backend.data + 1) + uVar29 + 8);
      local_be8 = uVar29 - 0x80;
      local_af8.prec_elem = *(int32_t *)((long)(&pnVar1[-1].m_backend.data + 1) + uVar29 + 0xc);
      fVar27 = cpp_dec_float_NaN;
      if (local_af8.fpclass == cpp_dec_float_NaN) {
LAB_0054673b:
        iVar14 = local_af8.prec_elem;
        bVar6 = local_af8.neg;
        iVar7 = local_af8.exp;
        pcVar22 = &local_af8;
        puVar23 = local_a0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar23 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        }
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_2e0,local_bf0);
        puVar23 = local_a0;
        puVar24 = (uint *)local_c78;
        for (lVar11 = 0x1c; uVar20 = local_bc8, lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar24 = *puVar23;
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
          puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
        }
        local_c00._4_4_ = iVar14;
        local_c00._0_4_ = fVar27;
        bStack_c04 = bVar6;
        if (((bVar6 & 1U) != 0) && (local_c78._0_4_ != 0 || fVar27 != cpp_dec_float_finite)) {
          bStack_c04 = (bool)(bVar6 ^ 1);
        }
        iStack_c08 = iVar7;
        if ((fVar27 == cpp_dec_float_NaN) || (local_2e0.fpclass == cpp_dec_float_NaN))
        goto LAB_00546892;
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_c78,&local_2e0);
        if (0 < iVar7) goto LAB_00546892;
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,0.0);
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])
                  (lp,(ulong)((int)uVar20 - 1),(cpp_dec_float<200U,_int,_void> *)local_c78,0);
        local_bd8 = (ulong)((int)local_bd8 + 1);
        uVar19 = local_be8;
      }
      else {
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,0.0);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_af8,(cpp_dec_float<200U,_int,_void> *)local_c78);
        uVar20 = local_bc8;
        fVar27 = local_af8.fpclass;
        if (iVar7 != 0) goto LAB_0054673b;
LAB_00546892:
        ::soplex::infinity::__tls_init();
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_b98);
        uVar19 = local_be8;
        if (((local_af8.fpclass == cpp_dec_float_NaN) ||
            ((fpclass_type)local_c00 == cpp_dec_float_NaN)) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_af8,(cpp_dec_float<200U,_int,_void> *)local_c78),
           uVar19 = local_be8, iVar7 < 1)) {
LAB_00546a0f:
          ::soplex::infinity::__tls_init();
          local_c00._0_4_ = cpp_dec_float_finite;
          local_c00._4_4_ = 0x1c;
          _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        )ZEXT816(0);
          local_c68 = ZEXT816(0);
          local_c58 = ZEXT816(0);
          local_c48 = ZEXT816(0);
          local_c38 = ZEXT816(0);
          local_c28 = ZEXT816(0);
          local_c18[0] = 0;
          local_c18[1] = 0;
          stack0xfffffffffffff3f0 = 0;
          uStack_c0b = 0;
          iStack_c08 = 0;
          bStack_c04 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_bb8);
          if (((local_af8.fpclass == cpp_dec_float_NaN) ||
              ((fpclass_type)local_c00 == cpp_dec_float_NaN)) ||
             ((iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&local_af8,(cpp_dec_float<200U,_int,_void> *)local_c78),
              -1 < iVar7 ||
              (((local_af8.fpclass == cpp_dec_float_NaN || (local_9e8.fpclass == cpp_dec_float_NaN))
               || (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&local_af8,&local_9e8), iVar7 < 1)))))) goto LAB_00546b64;
          ::soplex::infinity::__tls_init();
          local_c78 = (undefined1  [8])0x0;
          _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c68 = (undefined1  [16])0x0;
          local_c58 = (undefined1  [16])0x0;
          local_c48 = (undefined1  [16])0x0;
          local_c38 = (undefined1  [16])0x0;
          local_c28 = (undefined1  [16])0x0;
          pIVar30 = local_bb8;
        }
        else {
          pcVar22 = &local_9e8;
          pcVar25 = &local_b78;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar31 * -8 + 4);
          }
          local_b78.exp = local_9e8.exp;
          local_b78.neg = local_9e8.neg;
          local_b78.fpclass = local_9e8.fpclass;
          local_b78.prec_elem = local_9e8.prec_elem;
          if (local_b78.data._M_elems[0] != 0 || local_9e8.fpclass != cpp_dec_float_finite) {
            local_b78.neg = (bool)(local_9e8.neg ^ 1);
          }
          if (((local_9e8.fpclass == cpp_dec_float_NaN) || (local_af8.fpclass == cpp_dec_float_NaN))
             || (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_af8,&local_b78), -1 < iVar7)) goto LAB_00546a0f;
          ::soplex::infinity::__tls_init();
          _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        )ZEXT816(0);
          local_c68 = ZEXT816(0);
          local_c58 = ZEXT816(0);
          local_c48 = ZEXT816(0);
          local_c38 = ZEXT816(0);
          local_c28 = ZEXT816(0);
          pIVar30 = local_b98;
        }
        stack0xfffffffffffff3f0 = 0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        bStack_c04 = false;
        iStack_c08 = 0;
        uStack_c0b = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)pIVar30);
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])
                  (lp,(ulong)((int)uVar20 - 1),(cpp_dec_float<200U,_int,_void> *)local_c78,0);
        local_bd8 = (ulong)((int)local_bd8 + 1);
      }
LAB_00546b64:
      pnVar1 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar23 = (uint *)((long)(pnVar1->m_backend).data._M_elems + uVar19);
      pcVar22 = &local_b78;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar22->data)._M_elems[0] = *puVar23;
        puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
      }
      local_b78.exp = *(int *)((long)(&(pnVar1->m_backend).data + 1) + uVar19);
      local_b78.neg = (bool)*(byte *)((long)(&(pnVar1->m_backend).data + 1) + uVar19 + 4);
      local_b78.fpclass = *(fpclass_type *)((long)(&(pnVar1->m_backend).data + 1) + uVar19 + 8);
      local_b78.prec_elem = *(int32_t *)((long)(&(pnVar1->m_backend).data + 1) + uVar19 + 0xc);
      iVar14 = local_b78.prec_elem;
      fVar27 = cpp_dec_float_NaN;
      if (local_b78.fpclass == cpp_dec_float_NaN) {
LAB_00546c4f:
        bVar6 = local_b78.neg;
        iVar7 = local_b78.exp;
        pcVar22 = &local_b78;
        puVar23 = local_110;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar23 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        }
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_360,local_bf0);
        puVar23 = local_110;
        puVar24 = (uint *)local_c78;
        for (lVar11 = 0x1c; uVar20 = local_bc8, lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar24 = *puVar23;
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
          puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
        }
        local_c00._4_4_ = iVar14;
        local_c00._0_4_ = fVar27;
        bStack_c04 = bVar6;
        if (((bVar6 & 1U) != 0) && (local_c78._0_4_ != 0 || fVar27 != cpp_dec_float_finite)) {
          bStack_c04 = (bool)(bVar6 ^ 1);
        }
        iStack_c08 = iVar7;
        if (((fVar27 == cpp_dec_float_NaN) || (local_360.fpclass == cpp_dec_float_NaN)) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_c78,&local_360), 0 < iVar7))
        goto LAB_00546d61;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        pIVar30 = (Item *)0x0;
LAB_00547031:
        stack0xfffffffffffff3f0 = 0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        bStack_c04 = false;
        iStack_c08 = 0;
        uStack_c0b = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)pIVar30);
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])
                  (lp,(ulong)((int)uVar20 - 1),(cpp_dec_float<200u,int,void> *)local_c78,0);
        local_bd8 = (ulong)((int)local_bd8 + 1);
        uVar29 = local_be8;
      }
      else {
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,0.0);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b78,(cpp_dec_float<200U,_int,_void> *)local_c78);
        if (iVar7 != 0) {
          iVar14 = local_b78.prec_elem;
          fVar27 = local_b78.fpclass;
          goto LAB_00546c4f;
        }
LAB_00546d61:
        ::soplex::infinity::__tls_init();
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_b98);
        if (((local_b78.fpclass != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c00 != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_b78,(cpp_dec_float<200U,_int,_void> *)local_c78), 0 < iVar7))
        {
          pcVar22 = &local_9e8;
          puVar23 = (uint *)local_a78;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar23 = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
          }
          iStack_a08 = local_9e8.exp;
          bStack_a04 = local_9e8.neg;
          local_a00._0_4_ = local_9e8.fpclass;
          local_a00._4_4_ = local_9e8.prec_elem;
          if (local_a78._0_4_ != 0 || local_9e8.fpclass != cpp_dec_float_finite) {
            bStack_a04 = (bool)(local_9e8.neg ^ 1);
          }
          if (((local_9e8.fpclass != cpp_dec_float_NaN) && (local_b78.fpclass != cpp_dec_float_NaN))
             && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_b78,(cpp_dec_float<200U,_int,_void> *)local_a78),
                iVar7 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_c68 = ZEXT816(0);
            local_c58 = ZEXT816(0);
            local_c48 = ZEXT816(0);
            local_c38 = ZEXT816(0);
            local_c28 = ZEXT816(0);
            pIVar30 = local_b98;
            goto LAB_00547031;
          }
        }
        ::soplex::infinity::__tls_init();
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_c68 = ZEXT816(0);
        local_c58 = ZEXT816(0);
        local_c48 = ZEXT816(0);
        local_c38 = ZEXT816(0);
        local_c28 = ZEXT816(0);
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_bb8);
        uVar29 = local_be8;
        if (((local_b78.fpclass != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c00 != cpp_dec_float_NaN)) &&
           ((iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_b78,(cpp_dec_float<200U,_int,_void> *)local_c78),
            uVar29 = local_be8, iVar7 < 0 &&
            (((local_b78.fpclass != cpp_dec_float_NaN && (local_9e8.fpclass != cpp_dec_float_NaN))
             && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_b78,&local_9e8), uVar29 = local_be8, 0 < iVar7)))))) {
          ::soplex::infinity::__tls_init();
          local_c00._0_4_ = cpp_dec_float_finite;
          local_c00._4_4_ = 0x1c;
          local_c78 = (undefined1  [8])0x0;
          _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c68 = (undefined1  [16])0x0;
          local_c58 = (undefined1  [16])0x0;
          local_c48 = (undefined1  [16])0x0;
          local_c38 = (undefined1  [16])0x0;
          local_c28 = (undefined1  [16])0x0;
          local_c18[0] = 0;
          local_c18[1] = 0;
          stack0xfffffffffffff3f0 = 0;
          uStack_c0b = 0;
          iStack_c08 = 0;
          bStack_c04 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_bb8);
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x36])
                    (lp,(ulong)((int)uVar20 - 1),(cpp_dec_float<200U,_int,_void> *)local_c78,0);
          local_bd8 = (ulong)((int)local_bd8 + 1);
        }
      }
      pnVar1 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_c00._0_4_ = cpp_dec_float_finite;
      local_c00._4_4_ = 0x1c;
      local_c78 = (undefined1  [8])0x0;
      _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c68 = (undefined1  [16])0x0;
      local_c58 = (undefined1  [16])0x0;
      local_c48 = (undefined1  [16])0x0;
      local_c38 = (undefined1  [16])0x0;
      local_c28 = (undefined1  [16])0x0;
      local_c18[0] = 0;
      local_c18[1] = 0;
      stack0xfffffffffffff3f0 = 0;
      uStack_c0b = 0;
      iStack_c08 = 0;
      bStack_c04 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_b98);
      pSVar16 = local_bf0;
      if (((*(int *)((long)(&(pnVar1->m_backend).data + 1) + uVar29 + 8) != 2) &&
          ((fpclass_type)local_c00 != cpp_dec_float_NaN)) &&
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)(pnVar1->m_backend).data._M_elems + uVar29),
                             (cpp_dec_float<200U,_int,_void> *)local_c78), pSVar16 = local_bf0,
         iVar7 < 1)) {
        pnVar1 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_a00._0_4_ = cpp_dec_float_finite;
        local_a00._4_4_ = 0x1c;
        local_a78._0_16_ = (undefined1  [16])0x0;
        local_a78._16_16_ = (undefined1  [16])0x0;
        local_a58 = (undefined1  [16])0x0;
        local_a48 = (undefined1  [16])0x0;
        local_a38 = (undefined1  [16])0x0;
        local_a28 = (undefined1  [16])0x0;
        local_a18 = SUB1613((undefined1  [16])0x0,0);
        uStack_a0b = 0;
        iStack_a08 = 0;
        bStack_a04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_a78,(double)local_bb8);
        pSVar16 = local_bf0;
        if (((*(int *)((long)(&(pnVar1->m_backend).data + 1) + uVar29 + 8) != 2) &&
            ((fpclass_type)local_a00 != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar1->m_backend).data._M_elems + uVar29),
                               (cpp_dec_float<200U,_int,_void> *)local_a78), pSVar16 = local_bf0,
           -1 < iVar7)) {
          this_02 = (FreeConstraintPS *)operator_new(0xd0);
          local_9f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (local_bf0->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_9f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (local_bf0->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_9f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_9f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_9f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_9f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_9f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          FreeConstraintPS::FreeConstraintPS(this_02,lp,(int)(uVar20 - 1),&local_9f8);
          local_c78 = (undefined1  [8])this_02;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c78 + 8),this_02);
          if (local_9f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_9f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
          ::push_back(&local_ba8->data,(value_type *)local_c78);
          pSVar16 = local_bf0;
          piVar10 = (local_bf0->m_rIdx).data;
          piVar10[uVar20 - 1] =
               piVar10[(long)(lp->
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum + -1];
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0xf])(lp,uVar20 - 1 & 0xffffffff);
          piVar10 = (pSVar16->m_stat).data + 1;
          *piVar10 = *piVar10 + 1;
          if (_Stack_c70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c70._M_pi);
          }
          local_ba0 = (ulong)((int)local_ba0 + 1);
        }
      }
      uVar19 = uVar20 - 1;
    } while (1 < uVar20);
  }
  local_be0 = 0;
  local_ba8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
               *)0x0;
  if (0 < (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_b88 = (Item *)((ulong)local_bb8 ^ 0x8000000000000000);
    uStack_b80 = uStack_bb0 ^ 0x8000000000000000;
    uVar19 = 0;
    local_ba8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                 *)0x0;
    local_be0 = 0;
    local_bcc = 0;
    do {
      pnVar1 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_be8 = uVar19;
      pnVar21 = pnVar1 + uVar19;
      pcVar22 = &local_af8;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar22->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar31 * -2 + 1) * 4);
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
      }
      local_af8.exp = pnVar1[uVar19].m_backend.exp;
      local_af8.neg = pnVar1[uVar19].m_backend.neg;
      local_af8.fpclass = pnVar1[uVar19].m_backend.fpclass;
      local_bc8 = uVar19 * 0x80;
      local_af8.prec_elem = pnVar1[uVar19].m_backend.prec_elem;
      fVar27 = cpp_dec_float_NaN;
      if (local_af8.fpclass == cpp_dec_float_NaN) {
LAB_0054745d:
        iVar14 = local_af8.prec_elem;
        bVar6 = local_af8.neg;
        iVar7 = local_af8.exp;
        pcVar22 = &local_af8;
        puVar23 = local_180;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar23 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        }
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_3e0,local_bf0);
        puVar23 = local_180;
        puVar24 = (uint *)local_c78;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar24 = *puVar23;
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
          puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
        }
        local_c00._4_4_ = iVar14;
        local_c00._0_4_ = fVar27;
        bStack_c04 = bVar6;
        if (((bVar6 & 1U) != 0) && (local_c78._0_4_ != 0 || fVar27 != cpp_dec_float_finite)) {
          bStack_c04 = (bool)(bVar6 ^ 1);
        }
        iStack_c08 = iVar7;
        if ((fVar27 == cpp_dec_float_NaN) || (local_3e0.fpclass == cpp_dec_float_NaN))
        goto LAB_00547590;
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_c78,&local_3e0);
        if (0 < iVar7) goto LAB_00547590;
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,0.0);
        pp_Var9 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._vptr_ClassArray;
        uVar19 = local_be8;
LAB_00547845:
        (*pp_Var9[0x2a])(lp,uVar19,local_c78,0);
        local_be0 = (ulong)((int)local_be0 + 1);
      }
      else {
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,0.0);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_af8,(cpp_dec_float<200U,_int,_void> *)local_c78);
        fVar27 = local_af8.fpclass;
        if (iVar7 != 0) goto LAB_0054745d;
LAB_00547590:
        ::soplex::infinity::__tls_init();
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_b88);
        uVar19 = local_be8;
        if (((local_af8.fpclass != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c00 != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_af8,(cpp_dec_float<200U,_int,_void> *)local_c78),
           uVar19 = local_be8, 0 < iVar7)) {
          pcVar22 = &local_9e8;
          pcVar25 = &local_b78;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar31 * -8 + 4);
          }
          local_b78.exp = local_9e8.exp;
          local_b78.neg = local_9e8.neg;
          local_b78.fpclass = local_9e8.fpclass;
          local_b78.prec_elem = local_9e8.prec_elem;
          if (local_b78.data._M_elems[0] != 0 || local_9e8.fpclass != cpp_dec_float_finite) {
            local_b78.neg = (bool)(local_9e8.neg ^ 1);
          }
          if (((local_9e8.fpclass == cpp_dec_float_NaN) || (local_af8.fpclass == cpp_dec_float_NaN))
             || (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_af8,&local_b78), -1 < iVar7)) goto LAB_0054770d;
          ::soplex::infinity::__tls_init();
          _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        )ZEXT816(0);
          local_c68 = ZEXT816(0);
          local_c58 = ZEXT816(0);
          local_c48 = ZEXT816(0);
          local_c38 = ZEXT816(0);
          local_c28 = ZEXT816(0);
          pIVar30 = local_b88;
LAB_00547835:
          stack0xfffffffffffff3f0 = 0;
          local_c18[0] = 0;
          local_c18[1] = 0;
          local_c00._0_4_ = cpp_dec_float_finite;
          local_c00._4_4_ = 0x1c;
          bStack_c04 = false;
          iStack_c08 = 0;
          uStack_c0b = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_c78,(double)pIVar30);
          pp_Var9 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray;
          uVar19 = uVar19 & 0xffffffff;
          goto LAB_00547845;
        }
LAB_0054770d:
        ::soplex::infinity::__tls_init();
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_c68 = ZEXT816(0);
        local_c58 = ZEXT816(0);
        local_c48 = ZEXT816(0);
        local_c38 = ZEXT816(0);
        local_c28 = ZEXT816(0);
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_bb8);
        if (((local_af8.fpclass != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c00 != cpp_dec_float_NaN)) &&
           ((iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_af8,(cpp_dec_float<200U,_int,_void> *)local_c78), iVar7 < 0
            && (((local_af8.fpclass != cpp_dec_float_NaN && (local_9e8.fpclass != cpp_dec_float_NaN)
                 ) && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&local_af8,&local_9e8), 0 < iVar7)))))) {
          ::soplex::infinity::__tls_init();
          local_c78 = (undefined1  [8])0x0;
          _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c68 = (undefined1  [16])0x0;
          local_c58 = (undefined1  [16])0x0;
          local_c48 = (undefined1  [16])0x0;
          local_c38 = (undefined1  [16])0x0;
          local_c28 = (undefined1  [16])0x0;
          pIVar30 = local_bb8;
          goto LAB_00547835;
        }
      }
      pnVar1 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar23 = (uint *)((long)(pnVar1->m_backend).data._M_elems + local_bc8);
      pcVar22 = &local_b78;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar22->data)._M_elems[0] = *puVar23;
        puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
      }
      local_b78.exp = *(int *)((long)(&(pnVar1->m_backend).data + 1) + local_bc8);
      local_b78.neg = (bool)*(byte *)((long)(&(pnVar1->m_backend).data + 1) + local_bc8 + 4);
      local_b78.fpclass = *(fpclass_type *)((long)(&(pnVar1->m_backend).data + 1) + local_bc8 + 8);
      local_b78.prec_elem = *(int32_t *)((long)(&(pnVar1->m_backend).data + 1) + local_bc8 + 0xc);
      iVar14 = local_b78.prec_elem;
      fVar27 = cpp_dec_float_NaN;
      if (local_b78.fpclass == cpp_dec_float_NaN) {
LAB_00547963:
        bVar6 = local_b78.neg;
        iVar7 = local_b78.exp;
        pcVar22 = &local_b78;
        puVar23 = local_260;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar23 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        }
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_460,local_bf0);
        puVar23 = local_260;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_c78;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
        }
        local_c00._4_4_ = iVar14;
        local_c00._0_4_ = fVar27;
        bStack_c04 = bVar6;
        if (((bVar6 & 1U) != 0) && (local_c78._0_4_ != 0 || fVar27 != cpp_dec_float_finite)) {
          bStack_c04 = (bool)(bVar6 ^ 1);
        }
        iStack_c08 = iVar7;
        if (((fVar27 == cpp_dec_float_NaN) || (local_460.fpclass == cpp_dec_float_NaN)) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_c78,&local_460), 0 < iVar7))
        goto LAB_00547a80;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        pSVar16 = local_bf0;
        pIVar30 = (Item *)0x0;
LAB_00547d0e:
        stack0xfffffffffffff3f0 = 0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        bStack_c04 = false;
        iStack_c08 = 0;
        uStack_c0b = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)pIVar30);
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2d])(lp,local_be8,(cpp_dec_float<200U,_int,_void> *)local_c78,0);
        local_be0 = (ulong)((int)local_be0 + 1);
      }
      else {
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,0.0);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b78,(cpp_dec_float<200U,_int,_void> *)local_c78);
        if (iVar7 != 0) {
          iVar14 = local_b78.prec_elem;
          fVar27 = local_b78.fpclass;
          goto LAB_00547963;
        }
LAB_00547a80:
        pSVar16 = local_bf0;
        ::soplex::infinity::__tls_init();
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_b88);
        if (((local_b78.fpclass != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c00 != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_b78,(cpp_dec_float<200U,_int,_void> *)local_c78), 0 < iVar7))
        {
          pcVar22 = &local_9e8;
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_a78;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar31 * -8 + 4);
          }
          iStack_a08 = local_9e8.exp;
          bStack_a04 = local_9e8.neg;
          local_a00._0_4_ = local_9e8.fpclass;
          local_a00._4_4_ = local_9e8.prec_elem;
          if (local_a78._0_4_ != 0 || local_9e8.fpclass != cpp_dec_float_finite) {
            bStack_a04 = (bool)(local_9e8.neg ^ 1);
          }
          if (((local_9e8.fpclass != cpp_dec_float_NaN) && (local_b78.fpclass != cpp_dec_float_NaN))
             && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_b78,(cpp_dec_float<200U,_int,_void> *)local_a78),
                iVar7 < 0)) {
            ::soplex::infinity::__tls_init();
            _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_c68 = ZEXT816(0);
            local_c58 = ZEXT816(0);
            local_c48 = ZEXT816(0);
            local_c38 = ZEXT816(0);
            local_c28 = ZEXT816(0);
            pIVar30 = local_b88;
            goto LAB_00547d0e;
          }
        }
        ::soplex::infinity::__tls_init();
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_c68 = ZEXT816(0);
        local_c58 = ZEXT816(0);
        local_c48 = ZEXT816(0);
        local_c38 = ZEXT816(0);
        local_c28 = ZEXT816(0);
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_bb8);
        if (((local_b78.fpclass != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c00 != cpp_dec_float_NaN)) &&
           ((iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_b78,(cpp_dec_float<200U,_int,_void> *)local_c78), iVar7 < 0
            && (((local_b78.fpclass != cpp_dec_float_NaN && (local_9e8.fpclass != cpp_dec_float_NaN)
                 ) && (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                               compare(&local_b78,&local_9e8), 0 < iVar7)))))) {
          ::soplex::infinity::__tls_init();
          local_c78 = (undefined1  [8])0x0;
          _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c68 = (undefined1  [16])0x0;
          local_c58 = (undefined1  [16])0x0;
          local_c48 = (undefined1  [16])0x0;
          local_c38 = (undefined1  [16])0x0;
          local_c28 = (undefined1  [16])0x0;
          pIVar30 = local_bb8;
          goto LAB_00547d0e;
        }
      }
      pcVar22 = &local_af8;
      pnVar13 = &local_660;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar31 * -2 + 1) * 4);
      }
      local_660.m_backend.exp = local_af8.exp;
      local_660.m_backend.neg = local_af8.neg;
      local_660.m_backend.fpclass = local_af8.fpclass;
      local_660.m_backend.prec_elem = local_af8.prec_elem;
      pcVar22 = &local_b78;
      pnVar13 = &local_6e0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar31 * -2 + 1) * 4);
      }
      local_6e0.m_backend.exp = local_b78.exp;
      local_6e0.m_backend.neg = local_b78.neg;
      local_6e0.m_backend.fpclass = local_b78.fpclass;
      local_6e0.m_backend.prec_elem = local_b78.prec_elem;
      this_00 = (pSVar16->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      this_01 = (pSVar16->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      eps = Tolerances::epsilon(this_00);
      bVar6 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_660,&local_6e0,eps);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (bVar6) {
        if (local_af8.neg == true) {
          local_af8.neg =
               local_af8.data._M_elems[0] == 0 && local_af8.fpclass == cpp_dec_float_finite;
        }
        if (local_b78.neg == true) {
          local_b78.neg =
               local_b78.data._M_elems[0] == 0 && local_b78.fpclass == cpp_dec_float_finite;
        }
        if (local_b78.fpclass == cpp_dec_float_NaN || local_af8.fpclass == cpp_dec_float_NaN) {
LAB_00547ed1:
          pcVar22 = &local_b78;
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_a78;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar31 * -8 + 4);
          }
          iStack_a08 = local_b78.exp;
          bStack_a04 = local_b78.neg;
          pcVar22 = &local_b78;
          local_a00._0_4_ = local_b78.fpclass;
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_af8,&local_b78);
          if (iVar7 < 1) {
            goto LAB_00547ed1;
          }
          pcVar22 = &local_af8;
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_a78;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar31 * -8 + 4);
          }
          iStack_a08 = local_af8.exp;
          bStack_a04 = local_af8.neg;
          pcVar22 = &local_af8;
          local_a00._0_4_ = local_af8.fpclass;
        }
        uVar19 = local_be8;
        local_a00._4_4_ = pcVar22->prec_elem;
        if ((fpclass_type)local_a00 != cpp_dec_float_NaN) {
          local_c00._0_4_ = cpp_dec_float_finite;
          local_c00._4_4_ = 0x1c;
          local_c78 = (undefined1  [8])0x0;
          _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c68 = (undefined1  [16])0x0;
          local_c58 = (undefined1  [16])0x0;
          local_c48 = (undefined1  [16])0x0;
          local_c38 = (undefined1  [16])0x0;
          local_c28 = (undefined1  [16])0x0;
          local_c18[0] = 0;
          local_c18[1] = 0;
          stack0xfffffffffffff3f0 = 0;
          uStack_c0b = 0;
          iStack_c08 = 0;
          bStack_c04 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_c78,1.0);
          iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_a78,
                             (cpp_dec_float<200U,_int,_void> *)local_c78);
          if (iVar7 < 0) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_a78,1.0);
          }
        }
        pIVar30 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem;
        iVar7 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[uVar19].idx;
        if (0 < pIVar30[iVar7].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused) {
          pIVar30 = pIVar30 + iVar7;
          iVar7 = 0;
          local_b98 = pIVar30;
          do {
            pNVar2 = (pIVar30->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            local_bc8 = CONCAT44(local_bc8._4_4_,iVar7);
            iVar8 = pNVar2[iVar7].val.m_backend.exp;
            bVar6 = pNVar2[iVar7].val.m_backend.neg;
            fVar27 = pNVar2[iVar7].val.m_backend.fpclass;
            iVar14 = pNVar2[iVar7].val.m_backend.prec_elem;
            memmove(&local_968,pNVar2 + iVar7,0x70);
            local_968.exp = iVar8;
            local_968.neg = bVar6;
            local_968.prec_elem = iVar14;
            local_968.fpclass = fVar27;
            if ((bVar6 == true) &&
               (local_968.data._M_elems[0] != 0 || fVar27 != cpp_dec_float_finite)) {
              local_968.neg = false;
            }
            pcVar22 = &local_968;
            pcVar25 = &local_860;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar22 + ((ulong)bVar31 * -2 + 1) * 4);
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar31 * -8 + 4);
            }
            local_860.exp = iVar8;
            local_860.neg = local_968.neg;
            local_860.fpclass = fVar27;
            local_860.prec_elem = iVar14;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&local_860,(cpp_dec_float<200U,_int,_void> *)local_a78);
            uVar5 = local_8e8._120_8_;
            pcVar22 = &local_8e8;
            pcVar25 = &local_760;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar25 + ((ulong)bVar31 * -2 + 1) * 4);
            }
            local_760.exp = local_8e8.exp;
            local_760.neg = local_8e8.neg;
            local_760.fpclass = local_8e8.fpclass;
            local_760.prec_elem = local_8e8.prec_elem;
            pcVar22 = &local_860;
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_c78;
            for (lVar11 = 0x1c; pIVar30 = local_b98, uVar19 = local_be8, lVar11 != 0;
                lVar11 = lVar11 + -1) {
              (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar31 * -8 + 4);
            }
            iStack_c08 = local_860.exp;
            bStack_c04 = local_860.neg;
            local_c00._0_4_ = local_860.fpclass;
            local_c00._4_4_ = local_860.prec_elem;
            if ((local_860.neg == true) &&
               (local_c78._0_4_ != 0 || local_860.fpclass != cpp_dec_float_finite)) {
              bStack_c04 = false;
            }
            if (((fpclass_type)uVar5 == cpp_dec_float_NaN || local_860.fpclass == cpp_dec_float_NaN)
               || (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_c78,&local_760),
                  uVar29 = local_bc8, 0 < iVar8)) {
              iVar7 = (int)local_bc8;
              fVar27 = local_968.fpclass;
              if ((local_968.fpclass == cpp_dec_float_NaN) ||
                 (local_9e8.fpclass == cpp_dec_float_NaN)) {
LAB_005482e5:
                pcVar22 = &local_968;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_c78;
                for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                  (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + ((ulong)bVar31 * -2 + 1) * 4);
                  pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar25 + (ulong)bVar31 * -8 + 4);
                }
                pcVar22 = &local_8e8;
                pcVar25 = &local_7e0;
                for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                  (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar31 * -8 + 4);
                  pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar25 + ((ulong)bVar31 * -2 + 1) * 4);
                }
                local_7e0.exp = local_8e8.exp;
                local_7e0.neg = local_8e8.neg;
                local_7e0.fpclass = local_8e8.fpclass;
                local_7e0.prec_elem = local_8e8.prec_elem;
                iStack_c08 = local_968.exp;
                bStack_c04 = local_968.neg;
                local_c00._4_4_ = local_968.prec_elem;
                local_c00._0_4_ = fVar27;
                if ((local_968.neg == true) &&
                   (local_c78._0_4_ != 0 || fVar27 != cpp_dec_float_finite)) {
                  bStack_c04 = false;
                }
                if ((((local_8e8.fpclass != cpp_dec_float_NaN && fVar27 != cpp_dec_float_NaN) &&
                     (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                              compare((cpp_dec_float<200U,_int,_void> *)local_c78,&local_7e0),
                     iVar8 < 1)) &&
                    (pSVar17 = (local_bf0->
                               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).spxout, pSVar17 != (SPxOut *)0x0)) &&
                   (0 < (int)pSVar17->m_verbosity)) {
                  local_c78._0_4_ = pSVar17->m_verbosity;
                  local_bbc = 1;
                  (*pSVar17->_vptr_SPxOut[2])(pSVar17,&local_bbc);
                  pSVar16 = local_bf0;
                  pSVar17 = (local_bf0->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (pSVar17->m_streams[pSVar17->m_verbosity],
                             "WMAISM06 Warning! Tiny matrix coefficient ",0x2a);
                  pnVar13 = &local_5e0;
                  pcVar22 = &local_968;
                  pnVar26 = pnVar13;
                  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                    (pnVar26->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar22 + ((ulong)bVar31 * -2 + 1) * 4);
                    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar26 + ((ulong)bVar31 * -2 + 1) * 4);
                  }
                  local_5e0.m_backend.exp = local_968.exp;
                  local_5e0.m_backend.neg = local_968.neg;
                  local_5e0.m_backend.fpclass = local_968.fpclass;
                  local_5e0.m_backend.prec_elem = local_968.prec_elem;
LAB_00548470:
                  boost::multiprecision::operator<<
                            (pSVar17->m_streams[pSVar17->m_verbosity],pnVar13);
                  cVar4 = (char)pSVar17->m_streams[pSVar17->m_verbosity];
                  std::ios::widen((char)*(undefined8 *)
                                         (*(long *)pSVar17->m_streams[pSVar17->m_verbosity] + -0x18)
                                  + cVar4);
                  iVar7 = (int)local_bc8;
                  std::ostream::put(cVar4);
                  std::ostream::flush();
                  pSVar17 = (pSVar16->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  (*pSVar17->_vptr_SPxOut[2])(pSVar17,local_c78);
                }
              }
              else {
                iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_968,&local_9e8);
                if (iVar8 < 1) {
                  fVar27 = local_968.fpclass;
                  goto LAB_005482e5;
                }
                pSVar17 = (local_bf0->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).spxout;
                if ((pSVar17 != (SPxOut *)0x0) && (0 < (int)pSVar17->m_verbosity)) {
                  local_c78._0_4_ = pSVar17->m_verbosity;
                  local_bbc = 1;
                  (*pSVar17->_vptr_SPxOut[2])(pSVar17,&local_bbc);
                  pSVar16 = local_bf0;
                  pSVar17 = (local_bf0->
                            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).spxout;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (pSVar17->m_streams[pSVar17->m_verbosity],
                             "WMAISM05 Warning! Big matrix coefficient ",0x29);
                  pnVar13 = &local_560;
                  pcVar22 = &local_968;
                  pnVar26 = pnVar13;
                  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                    (pnVar26->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar22 + ((ulong)bVar31 * -2 + 1) * 4);
                    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar26 + ((ulong)bVar31 * -2 + 1) * 4);
                  }
                  local_560.m_backend.exp = local_968.exp;
                  local_560.m_backend.neg = local_968.neg;
                  local_560.m_backend.fpclass = local_968.fpclass;
                  local_560.m_backend.prec_elem = local_968.prec_elem;
                  goto LAB_00548470;
                }
              }
              iVar7 = iVar7 + 1;
            }
            else {
              pIVar3 = (lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set.theitem;
              iVar8 = (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thekey
                      [(pIVar30->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem[iVar7].idx].idx;
              pNVar2 = pIVar3[iVar8].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              iVar7 = (int)local_bc8;
              if (pNVar2 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x0) {
                pIVar3 = pIVar3 + iVar8;
                pcVar12 = (char *)(long)(pIVar3->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .memused;
                if (0 < (long)pcVar12) {
                  piVar10 = &pNVar2->idx;
                  __filename = (char *)0x0;
                  do {
                    if (uVar19 == (uint)*piVar10) {
                      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)pIVar3,__filename);
                      break;
                    }
                    __filename = __filename + 1;
                    piVar10 = piVar10 + 0x21;
                  } while (pcVar12 != __filename);
                }
              }
              SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)pIVar30,(char *)(uVar29 & 0xffffffff));
              local_ba8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                           *)(ulong)((int)local_ba8 + 1);
            }
          } while (iVar7 < (pIVar30->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused);
        }
      }
      uVar19 = local_be8;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_a78,lp,(int)local_be8);
      fVar27 = cpp_dec_float_NaN;
      if ((fpclass_type)local_a00 == cpp_dec_float_NaN) {
LAB_005485a1:
        bVar6 = bStack_a04;
        iVar7 = iStack_a08;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_a78;
        puVar23 = local_1f0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          *puVar23 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
        }
        iVar14 = local_a00._4_4_;
        epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_4e0,local_bf0);
        puVar23 = local_1f0;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_c78;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar23;
          puVar23 = puVar23 + (ulong)bVar31 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
        }
        iStack_c08 = iVar7;
        bStack_c04 = bVar6;
        local_c00._4_4_ = iVar14;
        local_c00._0_4_ = fVar27;
        if ((bVar6 == true) && (local_c78._0_4_ != 0 || fVar27 != cpp_dec_float_finite)) {
          bStack_c04 = false;
        }
        uVar19 = local_be8;
        if (((fVar27 == cpp_dec_float_NaN) || (local_4e0.fpclass == cpp_dec_float_NaN)) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_c78,&local_4e0),
           uVar19 = local_be8, 0 < iVar7)) goto LAB_005486d9;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        pSVar16 = local_bf0;
        pIVar30 = (Item *)0x0;
LAB_00548971:
        stack0xfffffffffffff3f0 = 0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        bStack_c04 = false;
        iStack_c08 = 0;
        uStack_c0b = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)pIVar30);
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x24])
                  (lp,uVar19 & 0xffffffff,(cpp_dec_float<200U,_int,_void> *)local_c78,0);
        local_bcc = local_bcc + 1;
      }
      else {
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,0.0);
        iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_a78,
                           (cpp_dec_float<200U,_int,_void> *)local_c78);
        if (iVar7 != 0) {
          fVar27 = (fpclass_type)local_a00;
          goto LAB_005485a1;
        }
LAB_005486d9:
        pSVar16 = local_bf0;
        ::soplex::infinity::__tls_init();
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        local_c78 = (undefined1  [8])0x0;
        _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c68 = (undefined1  [16])0x0;
        local_c58 = (undefined1  [16])0x0;
        local_c48 = (undefined1  [16])0x0;
        local_c38 = (undefined1  [16])0x0;
        local_c28 = (undefined1  [16])0x0;
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_b88);
        if ((((fpclass_type)local_a00 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_c00 != cpp_dec_float_NaN)) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_a78,
                               (cpp_dec_float<200U,_int,_void> *)local_c78), 0 < iVar7)) {
          pcVar22 = &local_9e8;
          pcVar25 = &local_968;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar31 * -8 + 4);
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar25 + ((ulong)bVar31 * -2 + 1) * 4);
          }
          local_968.exp = local_9e8.exp;
          local_968.neg = local_9e8.neg;
          local_968.fpclass = local_9e8.fpclass;
          local_968.prec_elem = local_9e8.prec_elem;
          if (local_968.data._M_elems[0] != 0 || local_9e8.fpclass != cpp_dec_float_finite) {
            local_968.neg = (bool)(local_9e8.neg ^ 1);
          }
          if (((local_9e8.fpclass != cpp_dec_float_NaN) &&
              ((fpclass_type)local_a00 != cpp_dec_float_NaN)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_a78,&local_968), iVar7 < 0)
             ) {
            ::soplex::infinity::__tls_init();
            _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_c68 = ZEXT816(0);
            local_c58 = ZEXT816(0);
            local_c48 = ZEXT816(0);
            local_c38 = ZEXT816(0);
            local_c28 = ZEXT816(0);
            pIVar30 = local_b88;
            goto LAB_00548971;
          }
        }
        ::soplex::infinity::__tls_init();
        local_c00._0_4_ = cpp_dec_float_finite;
        local_c00._4_4_ = 0x1c;
        _local_c78 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_c68 = ZEXT816(0);
        local_c58 = ZEXT816(0);
        local_c48 = ZEXT816(0);
        local_c38 = ZEXT816(0);
        local_c28 = ZEXT816(0);
        local_c18[0] = 0;
        local_c18[1] = 0;
        stack0xfffffffffffff3f0 = 0;
        uStack_c0b = 0;
        iStack_c08 = 0;
        bStack_c04 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_c78,(double)local_bb8);
        if ((((((fpclass_type)local_a00 != cpp_dec_float_NaN) &&
              ((fpclass_type)local_c00 != cpp_dec_float_NaN)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_a78,
                                 (cpp_dec_float<200U,_int,_void> *)local_c78), iVar7 < 0)) &&
            (((fpclass_type)local_a00 != cpp_dec_float_NaN &&
             (local_9e8.fpclass != cpp_dec_float_NaN)))) &&
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_a78,&local_9e8), 0 < iVar7))
        {
          ::soplex::infinity::__tls_init();
          local_c78 = (undefined1  [8])0x0;
          _Stack_c70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c68 = (undefined1  [16])0x0;
          local_c58 = (undefined1  [16])0x0;
          local_c48 = (undefined1  [16])0x0;
          local_c38 = (undefined1  [16])0x0;
          local_c28 = (undefined1  [16])0x0;
          pIVar30 = local_bb8;
          goto LAB_00548971;
        }
      }
      uVar19 = uVar19 + 1;
    } while ((long)uVar19 <
             (long)(lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
  }
  iVar7 = (int)local_bd8;
  iVar8 = (int)local_ba0;
  iVar18 = (int)local_be0;
  iVar15 = (int)local_ba8;
  if (0 < iVar7 + iVar8 + local_bcc + iVar18 + iVar15) {
    piVar10 = &(pSVar16->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remRows;
    *piVar10 = *piVar10 + iVar8;
    piVar10 = &(pSVar16->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remNzos;
    *piVar10 = *piVar10 + iVar15;
    piVar10 = &(pSVar16->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgLRhs;
    *piVar10 = *piVar10 + iVar7;
    piVar10 = &(pSVar16->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar10 = *piVar10 + iVar18;
    pSVar17 = (pSVar16->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar17 != (SPxOut *)0x0) && (3 < (int)pSVar17->m_verbosity)) {
      local_c78._0_4_ = pSVar17->m_verbosity;
      local_af8.data._M_elems[0] = 4;
      (*pSVar17->_vptr_SPxOut[2])();
      pSVar17 = (pSVar16->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity],"Simplifier (extremes) removed ",0x1e);
      std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],iVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],iVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity]," non-zeros, ",0xc);
      std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],iVar18);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity]," col bounds, ",0xd);
      std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],iVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity]," row bounds, ",0xd);
      std::ostream::operator<<((ostream *)pSVar17->m_streams[pSVar17->m_verbosity],local_bcc);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity]," objective coefficients",0x17);
      cVar4 = (char)pSVar17->m_streams[pSVar17->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar17->m_streams[pSVar17->m_verbosity] + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      pSVar17 = (pSVar16->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar17->_vptr_SPxOut[2])(pSVar17,local_c78);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::handleExtremes(SPxLPBase<R>& lp)
{

   // This method handles extreme value of the given LP by
   //
   // 1. setting numbers of very small absolute values to zero and
   // 2. setting numbers of very large absolute values to R(-infinity) or +R(infinity), respectively.

   R maxVal  = R(infinity) / 5.0;
   R tol = feastol() * 1e-2;
   tol = (tol < this->epsZero()) ? this->epsZero() : tol;
   int  remRows = 0;
   int  remNzos = 0;
   int  chgBnds = 0;
   int  chgLRhs = 0;
   int  objCnt  = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // lhs
      R lhs = lp.lhs(i);

      if(lhs != 0.0 && isZero(lhs, this->epsZero()))
      {
         lp.changeLhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(lhs > R(-infinity) && lhs < -maxVal)
      {
         lp.changeLhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(lhs <  R(infinity) && lhs >  maxVal)
      {
         lp.changeLhs(i,  R(infinity));
         ++chgLRhs;
      }

      // rhs
      R rhs = lp.rhs(i);

      if(rhs != 0.0 && isZero(rhs, this->epsZero()))
      {
         lp.changeRhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(rhs > R(-infinity) && rhs < -maxVal)
      {
         lp.changeRhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(rhs <  R(infinity) && rhs >  maxVal)
      {
         lp.changeRhs(i,  R(infinity));
         ++chgLRhs;
      }

      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         removeRow(lp, i);
         ++remRows;

         ++m_stat[FREE_ROW];
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      // lower bound
      R lo = lp.lower(j);

      if(lo != 0.0 && isZero(lo, this->epsZero()))
      {
         lp.changeLower(j, R(0.0));
         ++chgBnds;
      }
      else if(lo > R(-infinity) && lo < -maxVal)
      {
         lp.changeLower(j, R(-infinity));
         ++chgBnds;
      }
      else if(lo <  R(infinity) && lo >  maxVal)
      {
         lp.changeLower(j,  R(infinity));
         ++chgBnds;
      }

      // upper bound
      R up = lp.upper(j);

      if(up != 0.0 && isZero(up, this->epsZero()))
      {
         lp.changeUpper(j, R(0.0));
         ++chgBnds;
      }
      else if(up > R(-infinity) && up < -maxVal)
      {
         lp.changeUpper(j, R(-infinity));
         ++chgBnds;
      }
      else if(up <  R(infinity) && up >  maxVal)
      {
         lp.changeUpper(j,  R(infinity));
         ++chgBnds;
      }

      // fixed columns will be eliminated later
      if(NE(lo, up, this->tolerances()->epsilon()))
      {
         lo = spxAbs(lo);
         up = spxAbs(up);

         R absBnd = (lo > up) ? lo : up;

         if(absBnd < 1.0)
            absBnd = 1.0;

         // non-zeros
         SVectorBase<R>& col = lp.colVector_w(j);
         int        i = 0;

         while(i < col.size())
         {
            R aij = spxAbs(col.value(i));

            if(isZero(aij * absBnd, tol))
            {
               SVectorBase<R>& row = lp.rowVector_w(col.index(i));
               int row_j = row.pos(j);

               // this changes col.size()
               if(row_j >= 0)
                  row.remove(row_j);

               col.remove(i);

               SPxOut::debug(this, "IMAISM04 aij={}  removed, absBnd={} \n", aij, absBnd);
               ++remNzos;
            }
            else
            {
               if(aij > maxVal)
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM05 Warning! Big matrix coefficient " << aij
                                  << std::endl);
               }
               else if(isZero(aij, tol))
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM06 Warning! Tiny matrix coefficient " << aij
                                  << std::endl);
               }

               ++i;
            }
         }
      }

      // objective
      R obj = lp.obj(j);

      if(obj != 0.0 && isZero(obj, this->epsZero()))
      {
         lp.changeObj(j, R(0.0));
         ++objCnt;
      }
      else if(obj > R(-infinity) && obj < -maxVal)
      {
         lp.changeObj(j, R(-infinity));
         ++objCnt;
      }
      else if(obj <  R(infinity) && obj >  maxVal)
      {
         lp.changeObj(j,  R(infinity));
         ++objCnt;
      }
   }

   if(remRows + remNzos + chgLRhs + chgBnds + objCnt > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;
      this->m_chgLRhs += chgLRhs;
      this->m_chgBnds += chgBnds;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (extremes) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros, "
                    << chgBnds << " col bounds, "
                    << chgLRhs << " row bounds, "
                    << objCnt  << " objective coefficients" << std::endl;)
   }

   assert(lp.isConsistent());
}